

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O2

bool __thiscall
AsyncRgbLedAnalyzer::DetectSpeedMode
          (AsyncRgbLedAnalyzer *this,double positiveTimeSec,double negativeTimeSec,BitState *value)

{
  BitState BVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  BitState local_68 [2];
  BitTiming local_60;
  
  this->mDidDetectHighSpeed = false;
  local_68[0] = BIT_LOW;
  local_68[1] = BIT_HIGH;
  lVar4 = 0;
  while (lVar4 != 8) {
    BVar1 = *(BitState *)((long)local_68 + lVar4);
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_60,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BVar1,false
              );
    bVar2 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
    lVar4 = lVar4 + 4;
    if (bVar2) goto code_r0x001075b2;
  }
  bVar2 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  if (!bVar2) goto LAB_0010761b;
  local_68[0] = BIT_LOW;
  local_68[1] = BIT_HIGH;
  lVar4 = 0;
  do {
    if (lVar4 == 8) {
LAB_0010761b:
      std::operator<<((ostream *)&std::cerr,"failed to classify: ");
      poVar3 = std::ostream::_M_insert<double>(positiveTimeSec);
      std::operator<<(poVar3,"/");
      poVar3 = std::ostream::_M_insert<double>(negativeTimeSec);
      std::endl<char,std::char_traits<char>>(poVar3);
      return false;
    }
    BVar1 = *(BitState *)((long)local_68 + lVar4);
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_60,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BVar1,true)
    ;
    bVar2 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
    lVar4 = lVar4 + 4;
  } while (!bVar2);
  this->mDidDetectHighSpeed = true;
  *value = BVar1;
LAB_00107612:
  this->mFirstBitAfterReset = false;
  return true;
code_r0x001075b2:
  *value = BVar1;
  goto LAB_00107612;
}

Assistant:

bool AsyncRgbLedAnalyzer::DetectSpeedMode( double positiveTimeSec, double negativeTimeSec, BitState& value )
{
    mDidDetectHighSpeed = false;

    // low speed bits
    for( const auto b : { BIT_LOW, BIT_HIGH } )
    {
        if( mSettings->DataTiming( b ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
        {
            value = b;
            mFirstBitAfterReset = false;
            return true;
        }
    }

    if( mSettings->IsHighSpeedSupported() )
    {
        // high speed bits
        for( const auto b : { BIT_LOW, BIT_HIGH } )
        {
            if( mSettings->DataTiming( b, true ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
            {
                mDidDetectHighSpeed = true;
                value = b;
                mFirstBitAfterReset = false;
                return true;
            }
        }
    } // of high-speed mode tests

    std::cerr << "failed to classify: " << positiveTimeSec << "/" << negativeTimeSec << std::endl;
    return false;
}